

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

void __thiscall astar::AStar::LoadMap(AStar *this,Map *map)

{
  bool bVar1;
  Map *map_local;
  AStar *this_local;
  
  Map::operator=(&this->map,map);
  while( true ) {
    bVar1 = std::
            priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
            ::empty(&this->openZone);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
    ::pop(&this->openZone);
  }
  std::
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::clear(&this->closeZone);
  return;
}

Assistant:

void AStar::LoadMap(const Map& map)
{
    this->map = map;
    while (!openZone.empty()) {
        openZone.pop();
    }
    closeZone.clear();
}